

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

void __thiscall gui::Panel::draw(Panel *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  RectangleShape *in_RSI;
  ContainerBase *in_RDI;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  Vector2f *in_stack_ffffffffffffffa8;
  RectangleShape *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_20;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_18;
  RectangleShape *local_10;
  
  local_10 = in_RSI;
  bVar1 = Widget::isVisible((Widget *)(in_RDI + 1));
  if (bVar1) {
    Widget::getTransform((Widget *)0x288f52);
    sf::operator*=((Transform *)in_stack_ffffffffffffffb0,(Transform *)in_stack_ffffffffffffffa8);
    std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x288f74);
    sf::RectangleShape::setSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x288fa7);
    sf::RenderTarget::draw
              ((RenderTarget *)states.transform.m_matrix._24_8_,
               (Drawable *)states.transform.m_matrix._16_8_,
               (RenderStates *)states.transform.m_matrix._8_8_);
    local_18 = ContainerBase::getChildren(in_RDI);
    local_20._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffa8);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              ((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator*(&local_20);
      in_stack_ffffffffffffffb0 = local_10;
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_10);
      sf::RenderTarget::draw
                ((RenderTarget *)states.transform.m_matrix._24_8_,
                 (Drawable *)states.transform.m_matrix._16_8_,
                 (RenderStates *)states.transform.m_matrix._8_8_);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void Panel::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}